

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O1

int arkSetAdaptivityMethod
              (void *arkode_mem,int imethod,int idefault,int pq,sunrealtype *adapt_params)

{
  long lVar1;
  int iVar2;
  SUNErrCode SVar3;
  SUNAdaptController C;
  int iVar4;
  int error_code;
  char *msgfmt;
  sunrealtype k1e;
  undefined4 uVar5;
  undefined4 uVar6;
  sunrealtype k1i;
  long leniw;
  long lenrw;
  long local_38;
  long local_30;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    iVar4 = -0x15;
    arkode_mem = (ARKodeMem)0x0;
    error_code = -0x15;
    iVar2 = 0xbdd;
  }
  else if (adapt_params == (sunrealtype *)0x0 && idefault != 1) {
    msgfmt = "NULL-valued adapt_params provided";
    iVar4 = -0x16;
    error_code = -0x16;
    iVar2 = 0xbe6;
  }
  else {
    iVar2 = SUNAdaptController_Space
                      (*(undefined8 *)(*(long *)((long)arkode_mem + 0x2e8) + 0x68),&local_30,
                       &local_38);
    if (iVar2 == 0) {
      *(long *)((long)arkode_mem + 0x350) = *(long *)((long)arkode_mem + 0x350) - local_38;
      *(long *)((long)arkode_mem + 0x348) = *(long *)((long)arkode_mem + 0x348) - local_30;
    }
    if (*(int *)(*(long *)((long)arkode_mem + 0x2e8) + 0x70) != 0) {
      iVar2 = SUNAdaptController_Destroy
                        (*(undefined8 *)(*(long *)((long)arkode_mem + 0x2e8) + 0x68));
      *(undefined4 *)(*(long *)((long)arkode_mem + 0x2e8) + 0x70) = 0;
      if (iVar2 != 0) {
        msgfmt = "SUNAdaptController_Destroy failure";
        iVar4 = -0x14;
        error_code = -0x14;
        iVar2 = 0xbfa;
        goto LAB_00138440;
      }
    }
    lVar1 = *(long *)((long)arkode_mem + 0x2e8);
    *(undefined8 *)(lVar1 + 0x68) = 0;
    k1e = 0.0;
    uVar5 = 0;
    uVar6 = 0;
    k1i = 0.0;
    if (idefault != 1) {
      k1e = *adapt_params;
      uVar5 = SUB84(adapt_params[1],0);
      uVar6 = (undefined4)((ulong)adapt_params[1] >> 0x20);
      k1i = adapt_params[2];
    }
    *(int *)(lVar1 + 0x60) = pq;
    switch(imethod) {
    case 0:
      C = SUNAdaptController_PID(*arkode_mem);
      if (C == (SUNAdaptController)0x0) {
        msgfmt = "SUNAdaptController_PID allocation failure";
        iVar4 = -0x14;
        error_code = -0x14;
        iVar2 = 0xc14;
      }
      else {
        if ((idefault == 1) ||
           (SVar3 = SUNAdaptController_SetParams_PID(C,k1e,-(double)CONCAT44(uVar6,uVar5),k1i),
           SVar3 == 0)) {
LAB_0013876b:
          iVar2 = SUNAdaptController_Space(C,&local_30,&local_38);
          if (iVar2 == 0) {
            *(long *)((long)arkode_mem + 0x350) = *(long *)((long)arkode_mem + 0x350) + local_38;
            *(long *)((long)arkode_mem + 0x348) = *(long *)((long)arkode_mem + 0x348) + local_30;
          }
          lVar1 = *(long *)((long)arkode_mem + 0x2e8);
          *(SUNAdaptController *)(lVar1 + 0x68) = C;
          *(undefined4 *)(lVar1 + 0x70) = 1;
          return 0;
        }
        SUNAdaptController_Destroy(C);
        msgfmt = "SUNAdaptController_SetParams_PID failure";
        iVar4 = -0x2f;
        error_code = -0x2f;
        iVar2 = 0xc1e;
      }
      break;
    case 1:
      C = SUNAdaptController_PI(*arkode_mem);
      if (C == (SUNAdaptController)0x0) {
        msgfmt = "SUNAdaptController_PI allocation failure";
        iVar4 = -0x14;
        error_code = -0x14;
        iVar2 = 0xc28;
      }
      else {
        if ((idefault == 1) ||
           (SVar3 = SUNAdaptController_SetParams_PI(C,k1e,-(double)CONCAT44(uVar6,uVar5)),
           SVar3 == 0)) goto LAB_0013876b;
        SUNAdaptController_Destroy(C);
        msgfmt = "SUNAdaptController_SetParams_PI failure";
        iVar4 = -0x2f;
        error_code = -0x2f;
        iVar2 = 0xc32;
      }
      break;
    case 2:
      C = SUNAdaptController_I(*arkode_mem);
      if (C == (SUNAdaptController)0x0) {
        msgfmt = "SUNAdaptController_I allocation failure";
        iVar4 = -0x14;
        error_code = -0x14;
        iVar2 = 0xc3c;
      }
      else {
        if ((idefault == 1) || (SVar3 = SUNAdaptController_SetParams_I(C,k1e), SVar3 == 0))
        goto LAB_0013876b;
        SUNAdaptController_Destroy(C);
        msgfmt = "SUNAdaptController_SetParams_I failure";
        iVar4 = -0x2f;
        error_code = -0x2f;
        iVar2 = 0xc46;
      }
      break;
    case 3:
      C = SUNAdaptController_ExpGus(*arkode_mem);
      if (C == (SUNAdaptController)0x0) {
        msgfmt = "SUNAdaptController_ExpGus allocation failure";
        iVar4 = -0x14;
        error_code = -0x14;
        iVar2 = 0xc50;
      }
      else {
        if ((idefault == 1) ||
           (SVar3 = SUNAdaptController_SetParams_ExpGus(C,k1e,(sunrealtype)CONCAT44(uVar6,uVar5)),
           SVar3 == 0)) goto LAB_0013876b;
        SUNAdaptController_Destroy(C);
        msgfmt = "SUNAdaptController_SetParams_ExpGus failure";
        iVar4 = -0x2f;
        error_code = -0x2f;
        iVar2 = 0xc5a;
      }
      break;
    case 4:
      C = SUNAdaptController_ImpGus(*arkode_mem);
      if (C == (SUNAdaptController)0x0) {
        msgfmt = "SUNAdaptController_ImpGus allocation failure";
        iVar4 = -0x14;
        error_code = -0x14;
        iVar2 = 0xc64;
      }
      else {
        if ((idefault == 1) ||
           (SVar3 = SUNAdaptController_SetParams_ImpGus(C,k1e,(sunrealtype)CONCAT44(uVar6,uVar5)),
           SVar3 == 0)) goto LAB_0013876b;
        SUNAdaptController_Destroy(C);
        msgfmt = "SUNAdaptController_SetParams_ImpGus failure";
        iVar4 = -0x2f;
        error_code = -0x2f;
        iVar2 = 0xc6e;
      }
      break;
    case 5:
      C = SUNAdaptController_ImExGus(*arkode_mem);
      if (C == (SUNAdaptController)0x0) {
        msgfmt = "SUNAdaptController_ImExGus allocation failure";
        iVar4 = -0x14;
        error_code = -0x14;
        iVar2 = 0xc78;
      }
      else {
        if ((idefault == 1) ||
           (SVar3 = SUNAdaptController_SetParams_ImExGus
                              (C,k1e,(sunrealtype)CONCAT44(uVar6,uVar5),k1i,k1i), SVar3 == 0))
        goto LAB_0013876b;
        SUNAdaptController_Destroy(C);
        msgfmt = "SUNAdaptController_SetParams_ImExGus failure";
        iVar4 = -0x2f;
        error_code = -0x2f;
        iVar2 = 0xc82;
      }
      break;
    default:
      msgfmt = "Illegal imethod";
      iVar4 = -0x16;
      error_code = -0x16;
      iVar2 = 0xc89;
    }
  }
LAB_00138440:
  arkProcessError((ARKodeMem)arkode_mem,error_code,iVar2,"arkSetAdaptivityMethod",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                  ,msgfmt);
  return iVar4;
}

Assistant:

int arkSetAdaptivityMethod(void* arkode_mem, int imethod, int idefault, int pq,
                           sunrealtype adapt_params[3])
{
  int retval;
  long int lenrw, leniw;
  sunrealtype k1, k2, k3;
  ARKodeMem ark_mem;
  SUNAdaptController C;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Check for illegal inputs */
  if ((idefault != 1) && (adapt_params == NULL))
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "NULL-valued adapt_params provided");
    return (ARK_ILL_INPUT);
  }

  /* Remove current SUNAdaptController object
     (delete if owned, and then nullify pointer) */
  retval = SUNAdaptController_Space(ark_mem->hadapt_mem->hcontroller, &lenrw,
                                    &leniw);
  if (retval == SUN_SUCCESS)
  {
    ark_mem->liw -= leniw;
    ark_mem->lrw -= lenrw;
  }
  if (ark_mem->hadapt_mem->owncontroller)
  {
    retval = SUNAdaptController_Destroy(ark_mem->hadapt_mem->hcontroller);
    ark_mem->hadapt_mem->owncontroller = SUNFALSE;
    if (retval != SUN_SUCCESS)
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "SUNAdaptController_Destroy failure");
      return (ARK_MEM_FAIL);
    }
  }
  ark_mem->hadapt_mem->hcontroller = NULL;

  /* set adaptivity parameters from inputs */
  k1 = k2 = k3 = ZERO;
  if (idefault != 1)
  {
    k1 = adapt_params[0];
    k2 = adapt_params[1];
    k3 = adapt_params[2];
  }
  ark_mem->hadapt_mem->pq = pq;

  /* Create new SUNAdaptController object based on "imethod" input, optionally setting
     the specified controller parameters */
  C = NULL;
  switch (imethod)
  {
  case (ARK_ADAPT_PID):
    C = SUNAdaptController_PID(ark_mem->sunctx);
    if (C == NULL)
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "SUNAdaptController_PID allocation failure");
      return (ARK_MEM_FAIL);
    }
    if (idefault != 1)
    {
      retval = SUNAdaptController_SetParams_PID(C, k1, -k2, k3);
      if (retval != SUN_SUCCESS)
      {
        (void)SUNAdaptController_Destroy(C);
        arkProcessError(ark_mem, ARK_CONTROLLER_ERR, __LINE__, __func__,
                        __FILE__, "SUNAdaptController_SetParams_PID failure");
        return (ARK_CONTROLLER_ERR);
      }
    }
    break;
  case (ARK_ADAPT_PI):
    C = SUNAdaptController_PI(ark_mem->sunctx);
    if (C == NULL)
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "SUNAdaptController_PI allocation failure");
      return (ARK_MEM_FAIL);
    }
    if (idefault != 1)
    {
      retval = SUNAdaptController_SetParams_PI(C, k1, -k2);
      if (retval != SUN_SUCCESS)
      {
        (void)SUNAdaptController_Destroy(C);
        arkProcessError(ark_mem, ARK_CONTROLLER_ERR, __LINE__, __func__,
                        __FILE__, "SUNAdaptController_SetParams_PI failure");
        return (ARK_CONTROLLER_ERR);
      }
    }
    break;
  case (ARK_ADAPT_I):
    C = SUNAdaptController_I(ark_mem->sunctx);
    if (C == NULL)
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "SUNAdaptController_I allocation failure");
      return (ARK_MEM_FAIL);
    }
    if (idefault != 1)
    {
      retval = SUNAdaptController_SetParams_I(C, k1);
      if (retval != SUN_SUCCESS)
      {
        (void)SUNAdaptController_Destroy(C);
        arkProcessError(ark_mem, ARK_CONTROLLER_ERR, __LINE__, __func__,
                        __FILE__, "SUNAdaptController_SetParams_I failure");
        return (ARK_CONTROLLER_ERR);
      }
    }
    break;
  case (ARK_ADAPT_EXP_GUS):
    C = SUNAdaptController_ExpGus(ark_mem->sunctx);
    if (C == NULL)
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "SUNAdaptController_ExpGus allocation failure");
      return (ARK_MEM_FAIL);
    }
    if (idefault != 1)
    {
      retval = SUNAdaptController_SetParams_ExpGus(C, k1, k2);
      if (retval != SUN_SUCCESS)
      {
        (void)SUNAdaptController_Destroy(C);
        arkProcessError(ark_mem, ARK_CONTROLLER_ERR, __LINE__, __func__,
                        __FILE__, "SUNAdaptController_SetParams_ExpGus failure");
        return (ARK_CONTROLLER_ERR);
      }
    }
    break;
  case (ARK_ADAPT_IMP_GUS):
    C = SUNAdaptController_ImpGus(ark_mem->sunctx);
    if (C == NULL)
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "SUNAdaptController_ImpGus allocation failure");
      return (ARK_MEM_FAIL);
    }
    if (idefault != 1)
    {
      retval = SUNAdaptController_SetParams_ImpGus(C, k1, k2);
      if (retval != SUN_SUCCESS)
      {
        (void)SUNAdaptController_Destroy(C);
        arkProcessError(ark_mem, ARK_CONTROLLER_ERR, __LINE__, __func__,
                        __FILE__, "SUNAdaptController_SetParams_ImpGus failure");
        return (ARK_CONTROLLER_ERR);
      }
    }
    break;
  case (ARK_ADAPT_IMEX_GUS):
    C = SUNAdaptController_ImExGus(ark_mem->sunctx);
    if (C == NULL)
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "SUNAdaptController_ImExGus allocation failure");
      return (ARK_MEM_FAIL);
    }
    if (idefault != 1)
    {
      retval = SUNAdaptController_SetParams_ImExGus(C, k1, k2, k3, k3);
      if (retval != SUN_SUCCESS)
      {
        (void)SUNAdaptController_Destroy(C);
        arkProcessError(ark_mem, ARK_CONTROLLER_ERR, __LINE__, __func__,
                        __FILE__, "SUNAdaptController_SetParams_ImExGus failure");
        return (ARK_CONTROLLER_ERR);
      }
    }
    break;
  default:
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Illegal imethod");
    return (ARK_ILL_INPUT);
  }

  /* Attach new SUNAdaptController object */
  retval = SUNAdaptController_Space(C, &lenrw, &leniw);
  if (retval == SUN_SUCCESS)
  {
    ark_mem->liw += leniw;
    ark_mem->lrw += lenrw;
  }
  ark_mem->hadapt_mem->hcontroller   = C;
  ark_mem->hadapt_mem->owncontroller = SUNTRUE;

  return (ARK_SUCCESS);
}